

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getData(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,int *leaveIdx,int idx,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *stab,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *degeneps,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *vec,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *low,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *upp,BreakpointSource src,
         number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *max)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int iVar4;
  Status SVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  long lVar7;
  byte bVar8;
  uint *puVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<200U,_int,_void> local_3b8;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar15 = 0;
  puVar9 = (uint *)(upd + idx);
  pcVar12 = &local_2b0;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pcVar12->data)._M_elems[0] = *puVar9;
    puVar9 = puVar9 + 1;
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((pcVar12->data)._M_elems + 1);
  }
  iVar4 = upd[idx].m_backend.exp;
  bVar1 = upd[idx].m_backend.neg;
  fVar2 = upd[idx].m_backend.fpclass;
  iVar3 = upd[idx].m_backend.prec_elem;
  puVar9 = (uint *)(upd + idx);
  pcVar12 = &local_338;
  local_2b0.exp = iVar4;
  local_2b0.neg = bVar1;
  local_2b0.fpclass = fVar2;
  local_2b0.prec_elem = iVar3;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pcVar12->data)._M_elems[0] = *puVar9;
    puVar9 = puVar9 + 1;
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((pcVar12->data)._M_elems + 1);
  }
  local_338.prec_elem = iVar3;
  local_338.fpclass = fVar2;
  local_338.neg = bVar1;
  if ((bVar1 == true) && (local_338.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
    local_338.neg = false;
  }
  bVar8 = 0;
  local_338.exp = iVar4;
  if ((fVar2 != cpp_dec_float_NaN) && ((stab->m_backend).fpclass != cpp_dec_float_NaN)) {
    iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_338,&stab->m_backend);
    bVar8 = (byte)((uint)iVar4 >> 0x1f);
  }
  if (bVar8 != 0) goto LAB_005d5e13;
  *leaveIdx = idx;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 0x1c;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems[6] = 0;
  local_3b8.data._M_elems[7] = 0;
  local_3b8.data._M_elems[8] = 0;
  local_3b8.data._M_elems[9] = 0;
  local_3b8.data._M_elems[10] = 0;
  local_3b8.data._M_elems[0xb] = 0;
  local_3b8.data._M_elems[0xc] = 0;
  local_3b8.data._M_elems[0xd] = 0;
  local_3b8.data._M_elems[0xe] = 0;
  local_3b8.data._M_elems[0xf] = 0;
  local_3b8.data._M_elems[0x10] = 0;
  local_3b8.data._M_elems[0x11] = 0;
  local_3b8.data._M_elems[0x12] = 0;
  local_3b8.data._M_elems[0x13] = 0;
  local_3b8.data._M_elems[0x14] = 0;
  local_3b8.data._M_elems[0x15] = 0;
  local_3b8.data._M_elems[0x16] = 0;
  local_3b8.data._M_elems[0x17] = 0;
  local_3b8.data._M_elems[0x18] = 0;
  local_3b8.data._M_elems[0x19] = 0;
  local_3b8.data._M_elems._104_5_ = 0;
  local_3b8.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  if (&local_3b8 != &max->m_backend) {
    pnVar6 = max;
    pcVar12 = &local_3b8;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pcVar12->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_3b8.exp = (max->m_backend).exp;
    local_3b8.neg = (max->m_backend).neg;
    local_3b8.fpclass = (max->m_backend).fpclass;
    local_3b8.prec_elem = (max->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_3b8,&local_2b0)
  ;
  pnVar6 = low;
  if (local_3b8.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_338,0,(type *)0x0);
    iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_3b8,&local_338);
    if (0 < iVar4) {
      pnVar6 = upp;
    }
  }
  pnVar10 = pnVar6 + idx;
  pnVar13 = val;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  iVar4 = pnVar6[idx].m_backend.exp;
  (val->m_backend).exp = iVar4;
  bVar1 = pnVar6[idx].m_backend.neg;
  (val->m_backend).neg = bVar1;
  fVar2 = pnVar6[idx].m_backend.fpclass;
  (val->m_backend).fpclass = fVar2;
  iVar3 = pnVar6[idx].m_backend.prec_elem;
  (val->m_backend).prec_elem = iVar3;
  pcVar12 = &vec[idx].m_backend;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 0x1c;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems[6] = 0;
  local_3b8.data._M_elems[7] = 0;
  local_3b8.data._M_elems[8] = 0;
  local_3b8.data._M_elems[9] = 0;
  local_3b8.data._M_elems[10] = 0;
  local_3b8.data._M_elems[0xb] = 0;
  local_3b8.data._M_elems[0xc] = 0;
  local_3b8.data._M_elems[0xd] = 0;
  local_3b8.data._M_elems[0xe] = 0;
  local_3b8.data._M_elems[0xf] = 0;
  local_3b8.data._M_elems[0x10] = 0;
  local_3b8.data._M_elems[0x11] = 0;
  local_3b8.data._M_elems[0x12] = 0;
  local_3b8.data._M_elems[0x13] = 0;
  local_3b8.data._M_elems[0x14] = 0;
  local_3b8.data._M_elems[0x15] = 0;
  local_3b8.data._M_elems[0x16] = 0;
  local_3b8.data._M_elems[0x17] = 0;
  local_3b8.data._M_elems[0x18] = 0;
  local_3b8.data._M_elems[0x19] = 0;
  local_3b8.data._M_elems._104_5_ = 0;
  local_3b8.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  if (&local_3b8 == pcVar12) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_3b8,&val->m_backend);
    if (local_3b8.data._M_elems[0] != 0 || local_3b8.fpclass != cpp_dec_float_finite) {
      local_3b8.neg = (bool)(local_3b8.neg ^ 1);
    }
  }
  else {
    if (&local_3b8 != &val->m_backend) {
      pnVar6 = val;
      pcVar11 = &local_3b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_3b8.prec_elem = iVar3;
      local_3b8.fpclass = fVar2;
      local_3b8.exp = iVar4;
      local_3b8.neg = bVar1;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_3b8,pcVar12);
  }
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 0x1c;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems[6] = 0;
  local_338.data._M_elems[7] = 0;
  local_338.data._M_elems[8] = 0;
  local_338.data._M_elems[9] = 0;
  local_338.data._M_elems[10] = 0;
  local_338.data._M_elems[0xb] = 0;
  local_338.data._M_elems[0xc] = 0;
  local_338.data._M_elems[0xd] = 0;
  local_338.data._M_elems[0xe] = 0;
  local_338.data._M_elems[0xf] = 0;
  local_338.data._M_elems[0x10] = 0;
  local_338.data._M_elems[0x11] = 0;
  local_338.data._M_elems[0x12] = 0;
  local_338.data._M_elems[0x13] = 0;
  local_338.data._M_elems[0x14] = 0;
  local_338.data._M_elems[0x15] = 0;
  local_338.data._M_elems[0x16] = 0;
  local_338.data._M_elems[0x17] = 0;
  local_338.data._M_elems[0x18] = 0;
  local_338.data._M_elems[0x19] = 0;
  local_338.data._M_elems._104_5_ = 0;
  local_338.data._M_elems[0x1b]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_338,&local_3b8,&local_2b0);
  pcVar11 = &local_338;
  pnVar6 = val;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  (val->m_backend).exp = local_338.exp;
  (val->m_backend).neg = local_338.neg;
  (val->m_backend).fpclass = local_338.fpclass;
  (val->m_backend).prec_elem = local_338.prec_elem;
  if (((upp[idx].m_backend.fpclass == cpp_dec_float_NaN) ||
      (low[idx].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&upp[idx].m_backend,&low[idx].m_backend), iVar4 != 0)) {
    if ((max->m_backend).fpclass == cpp_dec_float_NaN) {
LAB_005d5c4e:
      if ((max->m_backend).fpclass == cpp_dec_float_NaN) goto LAB_005d5e13;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_338,0,(type *)0x0);
      iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&max->m_backend,&local_338);
      if (((-1 < iVar4) || ((val->m_backend).fpclass == cpp_dec_float_NaN)) ||
         (((degeneps->m_backend).fpclass == cpp_dec_float_NaN ||
          (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&val->m_backend,&degeneps->m_backend), iVar4 < 1))))
      goto LAB_005d5e13;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_338,0,(type *)0x0);
      iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&max->m_backend,&local_338);
      if (iVar4 < 1) goto LAB_005d5c4e;
      pnVar6 = degeneps;
      pcVar11 = &local_3b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_3b8.exp = (degeneps->m_backend).exp;
      local_3b8.neg = (degeneps->m_backend).neg;
      local_3b8.fpclass = (degeneps->m_backend).fpclass;
      local_3b8.prec_elem = (degeneps->m_backend).prec_elem;
      if (local_3b8.data._M_elems[0] != 0 || local_3b8.fpclass != cpp_dec_float_finite) {
        local_3b8.neg = (bool)(local_3b8.neg ^ 1);
      }
      if (((local_3b8.fpclass == cpp_dec_float_NaN) ||
          ((val->m_backend).fpclass == cpp_dec_float_NaN)) ||
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&val->m_backend,&local_3b8), -1 < iVar4)) goto LAB_005d5c4e;
    }
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)val,0.0);
    pSVar14 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    SVar5 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualStatus(&pSVar14->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(pSVar14->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).theBaseId.data + idx);
    if (SVar5 == D_ON_BOTH) goto LAB_005d5e13;
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 0x1c;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems[6] = 0;
    local_3b8.data._M_elems[7] = 0;
    local_3b8.data._M_elems[8] = 0;
    local_3b8.data._M_elems[9] = 0;
    local_3b8.data._M_elems[10] = 0;
    local_3b8.data._M_elems[0xb] = 0;
    local_3b8.data._M_elems[0xc] = 0;
    local_3b8.data._M_elems[0xd] = 0;
    local_3b8.data._M_elems[0xe] = 0;
    local_3b8.data._M_elems[0xf] = 0;
    local_3b8.data._M_elems[0x10] = 0;
    local_3b8.data._M_elems[0x11] = 0;
    local_3b8.data._M_elems[0x12] = 0;
    local_3b8.data._M_elems[0x13] = 0;
    local_3b8.data._M_elems[0x14] = 0;
    local_3b8.data._M_elems[0x15] = 0;
    local_3b8.data._M_elems[0x16] = 0;
    local_3b8.data._M_elems[0x17] = 0;
    local_3b8.data._M_elems[0x18] = 0;
    local_3b8.data._M_elems[0x19] = 0;
    local_3b8.data._M_elems._104_5_ = 0;
    local_3b8.data._M_elems[0x1b]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    if (&local_3b8 != &max->m_backend) {
      pnVar6 = max;
      pcVar11 = &local_3b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_3b8.exp = (max->m_backend).exp;
      local_3b8.neg = (max->m_backend).neg;
      local_3b8.fpclass = (max->m_backend).fpclass;
      local_3b8.prec_elem = (max->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_3b8,&local_2b0);
    if (local_3b8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_338,0,(type *)0x0);
      iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_3b8,&local_338);
      if (0 < iVar4) {
        pSVar14 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        pnVar6 = &local_1b0;
        pcVar11 = pcVar12;
        pnVar10 = pnVar6;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar10->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = pcVar12->exp;
        local_1b0.m_backend.neg = pcVar12->neg;
        local_1b0.m_backend.fpclass = pcVar12->fpclass;
        local_1b0.m_backend.prec_elem = pcVar12->prec_elem;
        goto LAB_005d5e0e;
      }
    }
    pSVar14 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    pcVar11 = pcVar12;
    pnVar6 = &local_230;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = pcVar12->exp;
    local_230.m_backend.neg = pcVar12->neg;
    local_230.m_backend.fpclass = pcVar12->fpclass;
    local_230.m_backend.prec_elem = pcVar12->prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound(pSVar14,idx,&local_230);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)val,0.0);
    pSVar14 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    pcVar11 = pcVar12;
    pnVar6 = &local_b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = pcVar12->exp;
    local_b0.m_backend.neg = pcVar12->neg;
    local_b0.m_backend.fpclass = pcVar12->fpclass;
    local_b0.m_backend.prec_elem = pcVar12->prec_elem;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftLBbound(pSVar14,idx,&local_b0);
    pSVar14 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
    pnVar6 = &local_130;
    pcVar11 = pcVar12;
    pnVar10 = pnVar6;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar15 * -8 + 4);
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = pcVar12->exp;
    local_130.m_backend.neg = pcVar12->neg;
    local_130.m_backend.fpclass = pcVar12->fpclass;
    local_130.m_backend.prec_elem = pcVar12->prec_elem;
LAB_005d5e0e:
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shiftUBbound(pSVar14,idx,pnVar6);
  }
LAB_005d5e13:
  return (bool)(bVar8 ^ 1);
}

Assistant:

bool SPxBoundFlippingRT<R>::getData(
   R&                 val,
   int&                  leaveIdx,
   int                   idx,
   R                  stab,
   R                  degeneps,
   const R*           upd,
   const R*           vec,
   const R*           low,
   const R*           upp,
   BreakpointSource      src,
   R                  max
)
{
   assert(src == FVEC);

   R x = upd[idx];

   // skip breakpoint if it is too small
   if(spxAbs(x) < stab)
   {
      return false;
   }

   leaveIdx = idx;
   val = (max * x > 0) ? upp[idx] : low[idx];
   val = (val - vec[idx]) / x;

   if(upp[idx] == low[idx])
   {
      val = 0.0;
      this->thesolver->shiftLBbound(idx, vec[idx]);
      this->thesolver->shiftUBbound(idx, vec[idx]);
   }
   else if((max > 0 && val < -degeneps) || (max < 0 && val > degeneps))
   {
      val = 0.0;

      if(this->thesolver->dualStatus(this->thesolver->baseId(idx)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(max * x > 0)
            this->thesolver->shiftUBbound(idx, vec[idx]);
         else
            this->thesolver->shiftLBbound(idx, vec[idx]);
      }
   }

   return true;
}